

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O3

int iutest::detail::iuPairwiseGeneratorBase::GetParam<2,int>
              (vector<int,_std::allocator<int>_> *params,ParamIndexes<2> *indexes,int raw)

{
  uint uVar1;
  int iVar2;
  Variable *pVVar3;
  uint uVar4;
  iuTypedRandom<int> rnd;
  Engine local_30;
  uniform_int_distribution<int> local_20;
  
  pVVar3 = TestEnv::get_vars();
  uVar4 = (pVVar3->m_genrand).m_engine.m_v1;
  uVar4 = uVar4 << 0xb ^ uVar4;
  uVar1 = (pVVar3->m_genrand).m_engine.m_v3;
  (pVVar3->m_genrand).m_engine.m_v1 = (pVVar3->m_genrand).m_engine.m_v2;
  (pVVar3->m_genrand).m_engine.m_v2 = uVar1;
  local_30.m_v4 = (pVVar3->m_genrand).m_engine.m_v4;
  (pVVar3->m_genrand).m_engine.m_v3 = local_30.m_v4;
  local_30.m_v4 = uVar4 >> 8 ^ local_30.m_v4 >> 0x13 ^ uVar4 ^ local_30.m_v4;
  (pVVar3->m_genrand).m_engine.m_v4 = local_30.m_v4;
  local_30.m_v3 = (local_30.m_v4 >> 0x1e ^ local_30.m_v4) * 0x6c078965 + 0x6c078965;
  local_30.m_v2 = (local_30.m_v3 >> 0x1e ^ local_30.m_v3) * 0x6c078965 + 0xd80f12ca;
  local_30.m_v1 = (local_30.m_v2 >> 0x1e ^ local_30.m_v2) * 0x6c078965 + 0x44169c2f;
  iVar2 = indexes->index[raw];
  if (iVar2 == -1) {
    local_20._M_param._M_b =
         (int)((ulong)((long)(params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2) + -1;
    local_20._M_param._M_a = 0;
    iVar2 = std::uniform_int_distribution<int>::operator()(&local_20,&local_30,&local_20._M_param);
  }
  return (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[iVar2];
}

Assistant:

static T GetParam(const ::std::vector<T>& params, const ParamIndexes<N>& indexes, int raw)
    {
        iuTypedRandom<int> rnd(TestEnv::genrand()());
        const int index = GetParamIndex(indexes, raw, static_cast<int>(params.size()), rnd);
        return params[index];
    }